

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publickey.c
# Opt level: O1

int publickey_packet_receive(LIBSSH2_PUBLICKEY *pkey,uchar **data,size_t *data_len)

{
  LIBSSH2_CHANNEL *channel;
  LIBSSH2_SESSION *session;
  size_t sVar1;
  uint32_t uVar2;
  int iVar3;
  size_t sVar4;
  ssize_t sVar5;
  uchar *puVar6;
  char *errmsg;
  uchar buffer [4];
  uchar local_2c [4];
  
  channel = pkey->channel;
  session = channel->session;
  *data = (uchar *)0x0;
  *data_len = 0;
  if (pkey->receive_state == libssh2_NB_state_idle) {
    sVar5 = _libssh2_channel_read(channel,0,(char *)local_2c,4);
    if (sVar5 == -0x25) {
      return -0x25;
    }
    if (sVar5 == 4) {
      uVar2 = _libssh2_ntohu32(local_2c);
      pkey->receive_packet_len = (ulong)uVar2;
      puVar6 = (uchar *)(*session->alloc)((ulong)uVar2,&session->abstract);
      pkey->receive_packet = puVar6;
      if (puVar6 != (uchar *)0x0) {
        pkey->receive_state = libssh2_NB_state_sent;
        goto LAB_0011ffcd;
      }
      errmsg = "Unable to allocate publickey response buffer";
      iVar3 = -6;
    }
    else {
      errmsg = "Invalid response from publickey subsystem";
      iVar3 = -0x24;
    }
LAB_001200b9:
    iVar3 = _libssh2_error(session,iVar3,errmsg);
  }
  else {
LAB_0011ffcd:
    if (pkey->receive_state == libssh2_NB_state_sent) {
      sVar4 = _libssh2_channel_read(channel,0,(char *)pkey->receive_packet,pkey->receive_packet_len)
      ;
      if (sVar4 == 0xffffffffffffffdb) {
        return -0x25;
      }
      sVar1 = pkey->receive_packet_len;
      if (sVar4 != sVar1) {
        (*session->free)(pkey->receive_packet,&session->abstract);
        pkey->receive_packet = (uchar *)0x0;
        pkey->receive_state = libssh2_NB_state_idle;
        errmsg = "Timeout waiting for publickey subsystem response packet";
        iVar3 = -0x1e;
        goto LAB_001200b9;
      }
      *data = pkey->receive_packet;
      *data_len = sVar1;
    }
    pkey->receive_state = libssh2_NB_state_idle;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int
publickey_packet_receive(LIBSSH2_PUBLICKEY * pkey,
                         unsigned char **data, size_t *data_len)
{
    LIBSSH2_CHANNEL *channel = pkey->channel;
    LIBSSH2_SESSION *session = channel->session;
    unsigned char buffer[4];
    ssize_t rc;
    *data = NULL; /* default to nothing returned */
    *data_len = 0;

    if(pkey->receive_state == libssh2_NB_state_idle) {
        rc = _libssh2_channel_read(channel, 0, (char *) buffer, 4);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return (int)rc;
        }
        else if(rc != 4) {
            return _libssh2_error(session, LIBSSH2_ERROR_PUBLICKEY_PROTOCOL,
                                  "Invalid response from publickey subsystem");
        }

        pkey->receive_packet_len = _libssh2_ntohu32(buffer);
        pkey->receive_packet =
            LIBSSH2_ALLOC(session, pkey->receive_packet_len);
        if(!pkey->receive_packet) {
            return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                  "Unable to allocate publickey response "
                                  "buffer");
        }

        pkey->receive_state = libssh2_NB_state_sent;
    }

    if(pkey->receive_state == libssh2_NB_state_sent) {
        rc = _libssh2_channel_read(channel, 0, (char *) pkey->receive_packet,
                                   pkey->receive_packet_len);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return (int)rc;
        }
        else if(rc != (ssize_t)pkey->receive_packet_len) {
            LIBSSH2_FREE(session, pkey->receive_packet);
            pkey->receive_packet = NULL;
            pkey->receive_state = libssh2_NB_state_idle;
            return _libssh2_error(session, LIBSSH2_ERROR_SOCKET_TIMEOUT,
                                  "Timeout waiting for publickey subsystem "
                                  "response packet");
        }

        *data = pkey->receive_packet;
        *data_len = pkey->receive_packet_len;
    }

    pkey->receive_state = libssh2_NB_state_idle;

    return 0;
}